

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O0

target_ulong_conflict helper_mftc0_tccontext_mipsel(CPUMIPSState_conflict2 *env)

{
  CPUMIPSState_conflict2 *pCVar1;
  CPUMIPSState_conflict2 *other;
  CPUMIPSState_conflict2 *pCStack_18;
  int other_tc;
  CPUMIPSState_conflict2 *env_local;
  
  other._4_4_ = env->CP0_VPEControl & 0xff;
  pCStack_18 = env;
  pCVar1 = mips_cpu_map_tc(env,(int *)((long)&other + 4));
  if (other._4_4_ == pCVar1->current_tc) {
    env_local._4_4_ = (pCVar1->active_tc).CP0_TCContext;
  }
  else {
    env_local._4_4_ = pCVar1->tcs[(int)other._4_4_].CP0_TCContext;
  }
  return env_local._4_4_;
}

Assistant:

target_ulong helper_mftc0_tccontext(CPUMIPSState *env)
{
    int other_tc = env->CP0_VPEControl & (0xff << CP0VPECo_TargTC);
    CPUMIPSState *other = mips_cpu_map_tc(env, &other_tc);

    if (other_tc == other->current_tc) {
        return other->active_tc.CP0_TCContext;
    } else {
        return other->tcs[other_tc].CP0_TCContext;
    }
}